

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::processElemDeclAttrs
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *elemDecl,XMLCh **valueConstraint
          ,bool isTopLevel)

{
  bool bVar1;
  int iVar2;
  XMLCh *pXVar3;
  XMLCh *str1;
  XMLCh *pXVar4;
  uint uVar5;
  
  pXVar3 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_FIXED,UnKnown);
  str1 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NILLABLE,Boolean);
  pXVar4 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_DEFAULT,UnKnown);
  *valueConstraint = pXVar4;
  if (pXVar3 == (XMLCh *)0x0) {
    uVar5 = 0;
  }
  else {
    if (pXVar4 != (XMLCh *)0x0) {
      pXVar4 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x34,pXVar4,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
    uVar5 = 4;
    *valueConstraint = pXVar3;
  }
  if (((str1 != (XMLCh *)0x0) && (*str1 != L'\0')) &&
     ((bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgATTVAL_TRUE), bVar1 ||
      (bVar1 = XMLString::equals(str1,L"1"), bVar1)))) {
    uVar5 = uVar5 | 1;
  }
  if (isTopLevel) {
    pXVar3 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_ABSTRACT,Boolean);
    if (((pXVar3 != (XMLCh *)0x0) && (*pXVar3 != L'\0')) &&
       ((bVar1 = XMLString::equals(pXVar3,(XMLCh *)SchemaSymbols::fgATTVAL_TRUE), bVar1 ||
        (bVar1 = XMLString::equals(pXVar3,L"1"), bVar1)))) {
      uVar5 = uVar5 | 2;
    }
    iVar2 = parseFinalSet(this,elem,3,false);
    elemDecl->fFinalSet = iVar2;
  }
  iVar2 = parseBlockSet(this,elem,0,false);
  elemDecl->fBlockSet = iVar2;
  elemDecl->fMiscFlags = uVar5;
  return;
}

Assistant:

void TraverseSchema::processElemDeclAttrs(const DOMElement* const elem,
                                          SchemaElementDecl* const elemDecl,
                                          const XMLCh*& valueConstraint,
                                          bool isTopLevel)
{
    int elementMiscFlags = 0;
    const XMLCh* fixedVal = getElementAttValue(elem, SchemaSymbols::fgATT_FIXED);
    const XMLCh* nillable = getElementAttValue(elem, SchemaSymbols::fgATT_NILLABLE, DatatypeValidator::Boolean);

    // check constraint value
    valueConstraint = getElementAttValue(elem, SchemaSymbols::fgATT_DEFAULT);
    if (fixedVal)
    {
        elementMiscFlags |= SchemaSymbols::XSD_FIXED;

        // if both default and fixed, emit an error
        if (valueConstraint)
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::ElementWithFixedAndDefault, getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName));

        // set constraint value to the fixed one
        valueConstraint = fixedVal;
    }

    // check nillable
    if (nillable && *nillable) {

        if (XMLString::equals(nillable, SchemaSymbols::fgATTVAL_TRUE)
            || XMLString::equals(nillable, fgValueOne)) {
            elementMiscFlags |= SchemaSymbols::XSD_NILLABLE;
        }
    }

    if (isTopLevel)
    {
        const XMLCh* bAbstract = getElementAttValue(elem, SchemaSymbols::fgATT_ABSTRACT, DatatypeValidator::Boolean);
        if (bAbstract && *bAbstract) {

            if (XMLString::equals(bAbstract, SchemaSymbols::fgATTVAL_TRUE)
                || XMLString::equals(bAbstract, fgValueOne)) {
                elementMiscFlags |= SchemaSymbols::XSD_ABSTRACT;
            }
        }

        elemDecl->setFinalSet(parseFinalSet(elem, EC_Final));
    }

    elemDecl->setBlockSet(parseBlockSet(elem, ES_Block));
    elemDecl->setMiscFlags(elementMiscFlags);
}